

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

void Fixpp::
     visitMessage<should_visit_unknown_tags_in_non_strict_mode::Visitor,should_visit_unknown_tags_in_non_strict_mode::VisitRules,Fixpp::TypedParsingContext<void>>
               (ParsingContext *context,Visitor *visitor,StreamCursor *param_3)

{
  bool bVar1;
  StreamCursor *cursor_00;
  char local_81;
  undefined1 local_70 [8];
  MessageVisitor<should_visit_unknown_tags_in_non_strict_mode::Visitor,_should_visit_unknown_tags_in_non_strict_mode::VisitRules>
  messageVisitor;
  pair<bool,_std::pair<const_char_*,_unsigned_long>_> msgType;
  pair<bool,_int> bodyLength;
  pair<bool,_std::pair<const_char_*,_unsigned_long>_> beginString;
  StreamCursor *cursor;
  Visitor *visitor_local;
  TypedParsingContext<void> *context_local;
  
  beginString.second.second = (unsigned_long)context->cursor;
  impl::matchTag<Fixpp::TagT<8u,Fixpp::Type::String>,std::pair<char_const*,unsigned_long>>
            ((pair<bool,_std::pair<const_char_*,_unsigned_long>_> *)&bodyLength,
             (impl *)beginString.second.second,param_3);
  bVar1 = StreamCursor::advance((StreamCursor *)beginString.second.second,1);
  if (bVar1) {
    msgType.second.second =
         (unsigned_long)
         impl::matchTag<Fixpp::TagT<9u,Fixpp::Type::Int>,int>
                   ((StreamCursor *)beginString.second.second);
    if ((msgType.second.second & 1) == 0) {
      bVar1 = StreamCursor::eof((StreamCursor *)beginString.second.second);
      if (bVar1) {
        local_81 = '?';
      }
      else {
        local_81 = StreamCursor::current((StreamCursor *)beginString.second.second);
      }
      ParsingContext::setError
                (context,ParsingError,"Could not parse BodyLength, expected int, got \'%c\'",
                 (ulong)(uint)(int)local_81);
    }
    else {
      bVar1 = StreamCursor::advance((StreamCursor *)beginString.second.second,1);
      if (bVar1) {
        impl::matchTag<Fixpp::TagT<35u,Fixpp::Type::String>,std::pair<char_const*,unsigned_long>>
                  ((pair<bool,_std::pair<const_char_*,_unsigned_long>_> *)&messageVisitor.visitor,
                   (impl *)beginString.second.second,cursor_00);
        bVar1 = StreamCursor::advance((StreamCursor *)beginString.second.second,1);
        if (bVar1) {
          ParsingContext::setVersion(context,(View *)&beginString);
          ParsingContext::setBodyLength(context,msgType.second.second._4_4_);
          ParsingContext::setMsgType(context,(View *)&msgType);
          impl::
          MessageVisitor<should_visit_unknown_tags_in_non_strict_mode::Visitor,_should_visit_unknown_tags_in_non_strict_mode::VisitRules>
          ::MessageVisitor((MessageVisitor<should_visit_unknown_tags_in_non_strict_mode::Visitor,_should_visit_unknown_tags_in_non_strict_mode::VisitRules>
                            *)local_70,(Context *)context,visitor);
          impl::
          visitMessage<Fixpp::impl::MessageVisitor<should_visit_unknown_tags_in_non_strict_mode::Visitor,should_visit_unknown_tags_in_non_strict_mode::VisitRules>,should_visit_unknown_tags_in_non_strict_mode::VisitRules,Fixpp::TypedParsingContext<void>>
                    (context,local_70);
        }
        else {
          ParsingContext::setError(context,Incomplete,"Expected Header after MsgType, got EOF");
        }
      }
      else {
        ParsingContext::setError(context,Incomplete,"Expected MsgType after BodyLength, got EOF");
      }
    }
  }
  else {
    ParsingContext::setError(context,Incomplete,"Expected BodyLength after BeginString, got EOFs");
  }
  return;
}

Assistant:

void visitMessage(Context& context, Visitor& visitor, Rules rules)
    {
        auto& cursor = context.cursor;
        auto beginString = impl::matchTag<Tag::BeginString>(cursor);

        TRY_ADVANCE("Expected BodyLength after BeginString, got EOFs");

        auto bodyLength = impl::matchTag<Tag::BodyLength>(cursor);
        if (!bodyLength.first)
        {
            context.setError(ErrorKind::ParsingError,
                             "Could not parse BodyLength, expected int, got '%c'",
                              CURSOR_CURRENT(cursor));
            return;
        }

        TRY_ADVANCE("Expected MsgType after BodyLength, got EOF");
        auto msgType = impl::matchTag<Tag::MsgType>(cursor);
        TRY_ADVANCE("Expected Header after MsgType, got EOF");

        context.setVersion(beginString.second);
        context.setBodyLength(bodyLength.second);
        context.setMsgType(msgType.second);

        impl::MessageVisitor<Visitor, Rules> messageVisitor(context, visitor);
        impl::visitMessage(context, messageVisitor, rules);
    }